

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O1

tuple<NS_*,_NS_*,_NS_*,_NS_*> * test_graphs::nested_rewrite_example(void)

{
  NS *graph;
  N *pNVar1;
  NS *graph_00;
  NS *this;
  NS *this_00;
  NS *graph_01;
  undefined8 *puVar2;
  NS *first;
  NS *rest;
  NS *rest_1;
  NS *first_00;
  NS *rest_00;
  NS *rest_1_00;
  NS *rest_2;
  NS *rest_3;
  undefined8 *puVar3;
  N *pNVar4;
  N *this_01;
  int __fd;
  tuple<NS_*,_NS_*,_NS_*,_NS_*> *in_RDI;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 local_98 [8];
  undefined1 auStack_90 [32];
  __type local_70;
  __type local_58;
  
  auStack_90._0_8_ = local_98;
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pNVar1 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(pNVar1,"");
  graph_00 = (NS *)operator_new(0x18);
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (NS *)operator_new(0x18);
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = (NS *)operator_new(0x18);
  *(undefined8 *)&(this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_> = 0;
  *(pointer *)((long)&(this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_> + 8) =
       (pointer)0x0;
  *(pointer *)((long)&(this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_> + 0x10) =
       (pointer)0x0;
  graph_01 = (NS *)operator_new(0x18);
  (graph_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  first = (NS *)operator_new(0x18);
  (first->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (first->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (first->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest = (NS *)operator_new(0x18);
  (rest->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (rest->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_1 = (NS *)operator_new(0x18);
  (rest_1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  first_00 = (NS *)operator_new(0x18);
  (first_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (first_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (first_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_00 = (NS *)operator_new(0x18);
  (rest_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_1_00 = (NS *)operator_new(0x18);
  (rest_1_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_1_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_1_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_2 = (NS *)operator_new(0x18);
  (rest_2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_3 = (NS *)operator_new(0x18);
  (rest_3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar3 = (undefined8 *)N::operator_new(0x78,graph_00);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = graph_01;
  *(undefined1 *)(puVar3 + 0xe) = 3;
  pNVar4 = (N *)N::operator_new(0x78,graph_00);
  (pNVar4->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar4->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar4->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar4->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pNVar4->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar4->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar4->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 **)
   &(pNVar4->data).
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u = puVar2;
  *(__index_type *)
   ((long)&(pNVar4->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  NS::wrap<NS*,NS*,NS*>(&local_70,this,first,rest,rest_1);
  NS::wrap<NS*,NS*,NS*,NS*,NS*>(&local_58,this_00,first_00,rest_00,rest_1_00,rest_2,rest_3);
  local_98 = (undefined1  [8])puVar3;
  __fd = (int)pNVar1;
  N::connect(pNVar4,__fd,(sockaddr *)local_98,1);
  pNVar1 = (N *)N::operator_new(0x78,graph_01);
  N::N<char_const*>(pNVar1,"Lonely citizen");
  uVar5 = local_70.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
          super__Head_base<1UL,_N_*,_false>._M_head_impl._0_4_;
  uVar6 = local_70.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
          super__Head_base<1UL,_N_*,_false>._M_head_impl._4_4_;
  local_98 = local_70.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
             _M_head_impl;
  register0x00001208 = (char)uVar5;
  register0x00001209 = (char)((uint)uVar5 >> 8);
  register0x0000120a = (char)((uint)uVar5 >> 0x10);
  register0x0000120b = (char)((uint)uVar5 >> 0x18);
  register0x0000120c = (char)uVar6;
  register0x0000120d = (char)((uint)uVar6 >> 8);
  register0x0000120e = (char)((uint)uVar6 >> 0x10);
  register0x0000120f = (char)((uint)uVar6 >> 0x18);
  N::connect((N *)local_70.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,__fd,
             (sockaddr *)local_98,2);
  pNVar1 = (N *)N::operator_new(0x78,first);
  N::N<char_const*>(pNVar1,"Mother");
  pNVar4 = (N *)N::operator_new(0x78,rest);
  N::N<char_const*>(pNVar4,"Father");
  this_01 = (N *)N::operator_new(0x78,first);
  N::N<char_const*>(this_01,"Child");
  auStack_90._0_8_ = pNVar4;
  local_98 = (undefined1  [8])pNVar1;
  N::connect(this_01,__fd,(sockaddr *)local_98,2);
  uVar5 = local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
          super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl.
          _0_4_;
  uVar6 = local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
          super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl.
          _4_4_;
  local_98 = local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<0UL,_N_*,_false>._M_head_impl;
  register0x00001208 = (char)uVar5;
  register0x00001209 = (char)((uint)uVar5 >> 8);
  register0x0000120a = (char)((uint)uVar5 >> 0x10);
  register0x0000120b = (char)((uint)uVar5 >> 0x18);
  register0x0000120c = (char)uVar6;
  register0x0000120d = (char)((uint)uVar6 >> 8);
  register0x0000120e = (char)((uint)uVar6 >> 0x10);
  register0x0000120f = (char)((uint)uVar6 >> 0x18);
  auStack_90._8_8_ =
       local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  auStack_90._16_4_ =
       (int)local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
            super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl;
  auStack_90._20_4_ =
       local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl._4_4_;
  N::connect((N *)local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,__fd,(sockaddr *)local_98,4);
  pNVar1 = (N *)N::operator_new(0x78,first_00);
  N::N<char_const*>(pNVar1,"Citizen");
  pNVar1 = (N *)N::operator_new(0x78,rest_00);
  N::N<char_const*>(pNVar1,"Citizen");
  pNVar1 = (N *)N::operator_new(0x78,rest_1_00);
  N::N<char_const*>(pNVar1,"Citizen");
  pNVar1 = (N *)N::operator_new(0x78,rest_2);
  N::N<char_const*>(pNVar1,"Citizen");
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*,_NS_*>.
  super__Tuple_impl<2UL,_NS_*,_NS_*>.super__Tuple_impl<3UL,_NS_*>.super__Head_base<3UL,_NS_*,_false>
  ._M_head_impl = this_00;
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*,_NS_*>.
  super__Tuple_impl<2UL,_NS_*,_NS_*>.super__Head_base<2UL,_NS_*,_false>._M_head_impl = this;
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl = graph_00;
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Head_base<0UL,_NS_*,_false>.
  _M_head_impl = graph;
  return in_RDI;
}

Assistant:

std::tuple<NS*, NS*, NS*, NS*> test_graphs::nested_rewrite_example() {
    auto context = new NS();
    auto neighbour = new(context) N("");
    auto one_neighbour = new NS(), two_neighbours = new NS(), four_neighbours = new NS();
    auto f1 = new NS(), t1 = new NS(), g1 = new NS(), g2 = new NS(), t3 = new NS(), h1 = new NS(), h2 = new NS(), h3 = new NS(), h4 = new NS(), t5 = new NS();
    auto [f1n, t1n] = one_neighbour->wrap(f1, t1); auto [g1n, g2n, t3n] = two_neighbours->wrap(g1, g2, t3); auto [h1n, h2n, h3n, h4n, t5n] = four_neighbours->wrap(h1, h2, h3, h4, t5);

    t1n->connect(neighbour, {f1n});
    auto t1s = new(f1) N("Lonely citizen");

    t3n->connect(neighbour, {g1n, g2n});
    auto mother = new(g1) N("Mother");
    auto father = new(g2) N("Father");
    auto child = new(g1) N("Child");
    child->connect(neighbour, {mother, father});

    t5n->connect(neighbour, {h1n, h2n, h3n, h4n});
    auto x = new(h1) N("Citizen");
    auto y = new(h2) N("Citizen");
    auto z = new(h3) N("Citizen");
    auto w = new(h4) N("Citizen");

    return {context, one_neighbour, two_neighbours, four_neighbours};
}